

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HammeringPattern.cpp
# Opt level: O3

PatternAddressMapper * __thiscall
HammeringPattern::get_most_effective_mapping(HammeringPattern *this)

{
  PatternAddressMapper *this_00;
  PatternAddressMapper *pPVar1;
  size_t sVar2;
  size_t sVar3;
  iterator __begin1;
  PatternAddressMapper *this_01;
  string local_48;
  
  this_00 = (this->address_mappings).
            super__Vector_base<PatternAddressMapper,_std::allocator<PatternAddressMapper>_>._M_impl.
            super__Vector_impl_data._M_start;
  pPVar1 = (this->address_mappings).
           super__Vector_base<PatternAddressMapper,_std::allocator<PatternAddressMapper>_>._M_impl.
           super__Vector_impl_data._M_finish;
  this_01 = this_00;
  if (this_00 == pPVar1) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"get_most_effective_mapping() failed: No mappings existing!","");
    Logger::log_error(&local_48,true);
    std::__cxx11::string::~string((string *)&local_48);
    exit(1);
  }
  do {
    sVar2 = PatternAddressMapper::count_bitflips(this_01);
    sVar3 = PatternAddressMapper::count_bitflips(this_00);
    if (sVar3 < sVar2) {
      PatternAddressMapper::operator=(this_00,this_01);
    }
    this_01 = this_01 + 1;
  } while (this_01 != pPVar1);
  return this_00;
}

Assistant:

PatternAddressMapper &HammeringPattern::get_most_effective_mapping() {
  if (address_mappings.empty()) {
    Logger::log_error("get_most_effective_mapping() failed: No mappings existing!");
    exit(EXIT_FAILURE);
  }
  PatternAddressMapper &best_mapping = address_mappings.front();
  for (const auto& mapping : address_mappings) {
    if (mapping.count_bitflips() > best_mapping.count_bitflips()) {
      best_mapping = mapping;
    }
  }
  return best_mapping;
}